

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O0

bool __thiscall Kernel::RobSubstitution::unify(RobSubstitution *this,TermSpec s,TermSpec t)

{
  pair<Kernel::TermSpec,_Kernel::TermSpec> elem;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>_>
  other;
  pair<Kernel::TermSpec,_Kernel::TermSpec> pair;
  socklen_t __len;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TermSpec *pTVar5;
  RobSubstitution *in_RDI;
  VarSpec VVar6;
  Elem c;
  StlIter __end6;
  StlIter __begin6;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
  *__range6;
  TermSpec dt2;
  TermSpec dt1;
  pair<Kernel::TermSpec,_Kernel::TermSpec> x;
  bool mismatch;
  anon_class_16_2_34b98b3f pushTodo;
  DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *encountered;
  BacktrackData localBD;
  TermSpec *in_stack_fffffffffffffd48;
  TermSpec *in_stack_fffffffffffffd50;
  StlIter *lhs;
  size_t in_stack_fffffffffffffd58;
  BacktrackData *bd;
  Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_> *in_stack_fffffffffffffd60;
  Backtrackable *this_00;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  TermSpec *in_stack_fffffffffffffd70;
  TermSpec *in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  byte in_stack_fffffffffffffd86;
  byte in_stack_fffffffffffffd87;
  StlIter *in_stack_fffffffffffffd90;
  StlIter *in_stack_fffffffffffffd98;
  BacktrackData *in_stack_fffffffffffffda0;
  Backtrackable *pBStack_258;
  anon_class_16_2_34b98b3f *in_stack_fffffffffffffe20;
  StlIter *in_stack_fffffffffffffe30;
  StlIter *pSVar7;
  StlIter *in_stack_fffffffffffffe38;
  BacktrackData *in_stack_fffffffffffffe40;
  TermList in_stack_fffffffffffffe48;
  TermSpec local_1a0 [3];
  TermSpec *local_170;
  sockaddr *in_stack_fffffffffffffe98;
  VarSpec *in_stack_fffffffffffffea0;
  TermList in_stack_fffffffffffffea8;
  uint64_t local_148;
  int local_140;
  uint64_t local_138;
  int local_130;
  uint64_t local_128;
  int local_120;
  sockaddr *local_118;
  undefined8 local_110;
  uint64_t local_108;
  int local_100;
  uint64_t local_f8;
  int local_f0;
  uint64_t local_e8;
  int local_e0;
  uint64_t local_d8;
  int local_d0;
  sockaddr *local_c8;
  undefined8 local_c0;
  sockaddr *local_b8;
  VarSpec *local_b0;
  pair<Kernel::TermSpec,_Kernel::TermSpec> local_a8;
  byte local_81;
  DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
  **local_78;
  DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_70 [2];
  StlIter *local_60;
  BacktrackData *local_58;
  Backtrackable *local_50;
  BacktrackData local_38 [6];
  bool local_1;
  
  bVar2 = Kernel::TermSpec::sameTermContent(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  if (bVar2) {
    local_1 = true;
  }
  else {
    Lib::BacktrackData::BacktrackData(local_38);
    Lib::Backtrackable::bdRecord
              ((Backtrackable *)in_stack_fffffffffffffd50,(BacktrackData *)in_stack_fffffffffffffd48
              );
    if ((unify(Kernel::TermSpec,Kernel::TermSpec)::toDo == '\0') &&
       (iVar3 = __cxa_guard_acquire(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo), iVar3 != 0)) {
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::Stack
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      __cxa_atexit(Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::~Stack,&unify::toDo,
                   &__dso_handle);
      __cxa_guard_release(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo);
    }
    std::make_pair<Kernel::TermSpec,Kernel::TermSpec>
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    elem.first._8_7_ = in_stack_fffffffffffffd68;
    elem.first.term._content = (uint64_t)local_50;
    elem.first._15_1_ = in_stack_fffffffffffffd6f;
    elem.second.term._content = (uint64_t)in_stack_fffffffffffffd70;
    elem.second._8_8_ = in_stack_fffffffffffffd78;
    Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::push
              ((Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_> *)local_60,elem);
    lhs = local_60;
    bd = local_58;
    this_00 = local_50;
    if ((unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_),
       lhs = local_60, bd = local_58, this_00 = local_50, iVar3 != 0)) {
      Lib::DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::DHSet((DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)0x95958e);
      __cxa_atexit(Lib::
                   DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
                   ::~DHSet,&unify::encountered_,&__dso_handle);
      __cxa_guard_release(&unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_);
      lhs = local_60;
      bd = local_58;
      this_00 = local_50;
    }
    local_70[0] = &unify::encountered_;
    Lib::DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>::
    reset((DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)0x9595d2);
    local_78 = local_70;
    local_81 = 0;
LAB_009595f7:
    bVar2 = Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::isNonEmpty(&unify::toDo);
    if (bVar2) {
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::pop(&local_a8,&unify::toDo);
      pTVar5 = derefBound(in_RDI,(TermSpec *)
                                 CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT24(in_stack_fffffffffffffd84,
                                                            in_stack_fffffffffffffd80))));
      local_b8 = (sockaddr *)(pTVar5->term)._content;
      local_b0 = *(VarSpec **)&pTVar5->index;
      pTVar5 = derefBound(in_RDI,(TermSpec *)
                                 CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT24(in_stack_fffffffffffffd84,
                                                            in_stack_fffffffffffffd80))));
      local_c8 = (sockaddr *)(pTVar5->term)._content;
      local_c0 = *(undefined8 *)&pTVar5->index;
      bVar2 = Kernel::TermSpec::sameTermContent(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70)
      ;
      if (!bVar2) {
        bVar2 = Kernel::TermSpec::isVar((TermSpec *)0x9596ed);
        in_stack_fffffffffffffd87 = 0;
        if (bVar2) {
          VVar6 = Kernel::TermSpec::varSpec((TermSpec *)lhs);
          local_e8 = (uint64_t)VVar6._self._content;
          local_e0 = VVar6.index;
          local_d8 = local_e8;
          local_d0 = local_e0;
          bVar2 = occurs((RobSubstitution *)in_stack_fffffffffffffea8._content,
                         in_stack_fffffffffffffea0,(TermSpec *)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffd87 = bVar2 ^ 0xff;
        }
        if ((in_stack_fffffffffffffd87 & 1) == 0) {
          bVar2 = Kernel::TermSpec::isVar((TermSpec *)0x9597f0);
          in_stack_fffffffffffffd86 = 0;
          if (bVar2) {
            VVar6 = Kernel::TermSpec::varSpec((TermSpec *)lhs);
            local_138 = (uint64_t)VVar6._self._content;
            local_130 = VVar6.index;
            local_128 = local_138;
            local_120 = local_130;
            bVar2 = occurs((RobSubstitution *)in_stack_fffffffffffffea8._content,
                           in_stack_fffffffffffffea0,(TermSpec *)in_stack_fffffffffffffe98);
            in_stack_fffffffffffffd86 = bVar2 ^ 0xff;
          }
          if ((in_stack_fffffffffffffd86 & 1) != 0) {
            VVar6 = Kernel::TermSpec::varSpec((TermSpec *)lhs);
            in_stack_fffffffffffffea8 = VVar6._self._content;
            local_140 = VVar6.index;
            in_stack_fffffffffffffe98 = local_b8;
            in_stack_fffffffffffffea0 = local_b0;
            local_148 = in_stack_fffffffffffffea8._content;
            bind(in_RDI,(int)&local_148,local_b8,(socklen_t)local_b0);
            goto LAB_009595f7;
          }
          bVar2 = Kernel::TermSpec::isTerm((TermSpec *)0x9598f3);
          if ((bVar2) && (bVar2 = Kernel::TermSpec::isTerm((TermSpec *)0x959909), bVar2)) {
            in_stack_fffffffffffffd80 = Kernel::TermSpec::functor((TermSpec *)0x95991f);
            uVar4 = Kernel::TermSpec::functor((TermSpec *)0x959930);
            if (in_stack_fffffffffffffd80 == uVar4) {
              in_stack_fffffffffffffd70 = (TermSpec *)&stack0xfffffffffffffe48;
              Kernel::TermSpec::allArgs
                        ((TermSpec *)
                         CONCAT17(in_stack_fffffffffffffd87,
                                  CONCAT16(in_stack_fffffffffffffd86,
                                           CONCAT24(in_stack_fffffffffffffd84,
                                                    in_stack_fffffffffffffd80))));
              lhs = in_stack_fffffffffffffe38;
              bd = in_stack_fffffffffffffe40;
              Kernel::TermSpec::allArgs
                        ((TermSpec *)
                         CONCAT17(in_stack_fffffffffffffd87,
                                  CONCAT16(in_stack_fffffffffffffd86,
                                           CONCAT24(in_stack_fffffffffffffd84,
                                                    in_stack_fffffffffffffd80))));
              in_stack_fffffffffffffd78 = local_1a0;
              other._iter._inner._0_8_ = in_stack_fffffffffffffd98;
              other._iter._func.this = (TermSpec *)in_stack_fffffffffffffd90;
              other._iter._16_8_ = in_stack_fffffffffffffda0;
              pSVar7 = in_stack_fffffffffffffe30;
              in_stack_fffffffffffffe38 = lhs;
              in_stack_fffffffffffffe40 = bd;
              Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::TermSpec::allArgs()const::{lambda(auto:1)#1},Kernel::TermSpec>>
              ::
              zip<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::TermSpec::allArgs()const::_lambda(auto:1)_1_,Kernel::TermSpec>>>
                        ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>_>
                          *)CONCAT17(in_stack_fffffffffffffd87,
                                     CONCAT16(in_stack_fffffffffffffd86,
                                              CONCAT24(in_stack_fffffffffffffd84,
                                                       in_stack_fffffffffffffd80))),other);
              local_170 = in_stack_fffffffffffffd78;
              Lib::
              IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
              ::begin((IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
                       *)in_stack_fffffffffffffe30);
              Lib::
              IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
              ::end((IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
                     *)in_stack_fffffffffffffe30);
              while (bVar2 = Lib::operator!=(lhs,in_stack_fffffffffffffe30), bVar2) {
                Lib::
                IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
                ::StlIter::operator*(lhs);
                bd = in_stack_fffffffffffffda0;
                std::make_pair<Kernel::TermSpec,Kernel::TermSpec>
                          ((TermSpec *)lhs,(TermSpec *)in_stack_fffffffffffffe30);
                lhs = in_stack_fffffffffffffd98;
                in_stack_fffffffffffffe30 = in_stack_fffffffffffffd90;
                pair.first._8_8_ = in_stack_fffffffffffffe38;
                pair.first.term._content = (uint64_t)pSVar7;
                pair.second.term._content = (uint64_t)in_stack_fffffffffffffe40;
                pair.second._8_8_ = in_stack_fffffffffffffe48._content;
                this_00 = pBStack_258;
                in_stack_fffffffffffffd90 = in_stack_fffffffffffffe30;
                in_stack_fffffffffffffd98 = lhs;
                in_stack_fffffffffffffda0 = bd;
                unify(Kernel::TermSpec,Kernel::TermSpec)::$_0::operator()
                          (in_stack_fffffffffffffe20,pair);
                Lib::
                IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
                ::StlIter::operator++(in_stack_fffffffffffffd90);
              }
              Lib::
              IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
              ::StlIter::~StlIter((StlIter *)0x959a0b);
              Lib::
              IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
              ::StlIter::~StlIter((StlIter *)0x959a18);
              in_stack_fffffffffffffe30 = pSVar7;
              goto LAB_009595f7;
            }
          }
          local_81 = 1;
          goto LAB_00959ae5;
        }
        VVar6 = Kernel::TermSpec::varSpec((TermSpec *)lhs);
        local_108 = (uint64_t)VVar6._self._content;
        local_100 = VVar6.index;
        local_118 = local_c8;
        local_110 = local_c0;
        uVar1 = local_110;
        local_110._0_4_ = (socklen_t)local_c0;
        __len = (socklen_t)local_110;
        local_110 = uVar1;
        local_f8 = local_108;
        local_f0 = local_100;
        bind(in_RDI,(int)&local_f8,local_c8,__len);
      }
      goto LAB_009595f7;
    }
LAB_00959ae5:
    if ((local_81 & 1) != 0) {
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::reset(&unify::toDo);
    }
    Lib::Backtrackable::bdDone((Backtrackable *)0x959b05);
    if ((local_81 & 1) == 0) {
      bVar2 = Lib::Backtrackable::bdIsRecording((Backtrackable *)lhs);
      if (bVar2) {
        Lib::Backtrackable::bdCommit(this_00,bd);
      }
      Lib::BacktrackData::drop((BacktrackData *)this_00);
    }
    else {
      Lib::BacktrackData::backtrack((BacktrackData *)this_00);
    }
    local_1 = (bool)((local_81 ^ 0xff) & 1);
  }
  return local_1;
}

Assistant:

bool RobSubstitution::unify(TermSpec s, TermSpec t)
{
#define DEBUG_UNIFY(lvl, ...) if (lvl < 0) DBG("unify: ", __VA_ARGS__)
  DEBUG_UNIFY(0, *this, ".unify(", s, ",", t, ")")


  if(s.sameTermContent(t)) {
    return true;
  }

  BacktrackData localBD;
  bdRecord(localBD);

  static Stack<pair<TermSpec, TermSpec>> toDo(64);
  ASS(toDo.isEmpty());
  toDo.push(make_pair(std::move(s), std::move(t)));

  // Save encountered unification pairs to avoid
  // recomputing their unification
  static DHSet<pair<TermSpec, TermSpec>> encountered_;
  auto encountered = &encountered_;
  encountered->reset();
  

  auto pushTodo = [&](auto pair) {
      // we unify each subterm pair at most once, to avoid worst-case exponential runtimes
      // in order to safe memory we do ot do this for variables.
      // (Note by joe:  didn't make this decision, but just keeping the implemenntation 
      // working as before. i.e. as described in the paper "Comparing Unification 
      // Algorithms in First-Order Theorem Proving", by Krystof and Andrei)
      if (pair.first.isVar() && isUnbound(pair.first.varSpec()) &&
          pair.second.isVar() && isUnbound(pair.second.varSpec())) {
        toDo.push(std::move(pair));
      } else if (!encountered->find(pair)) {
        encountered->insert(pair);
        toDo.push(std::move(pair));
      }
  };

  bool mismatch=false;
  // Iteratively resolve unification pairs in toDo
  // the current pair is always in t1 and t2 with their dereferenced
  // version in dt1 and dt2
  while (toDo.isNonEmpty()) {
    auto x = toDo.pop();
    TermSpec dt1 = derefBound(x.first);
    TermSpec dt2 = derefBound(x.second);
    DEBUG_UNIFY(1, "next pair: ", tie(dt1, dt2))
    // If they have the same content then skip
    // (note that sameTermContent is best-effort)
    if (dt1.sameTermContent(dt2)) {
    // Deal with the case where eithe rare variables
    // Do an occurs-check and note that the variable 
    // cannot be currently bound as we already dereferenced
    } else if(dt1.isVar() && !occurs(dt1.varSpec(), dt2)) {
      bind(dt1.varSpec(), dt2);

    } else if(dt2.isVar() && !occurs(dt2.varSpec(), dt1)) {
      bind(dt2.varSpec(), dt1);

    } else if(dt1.isTerm() && dt2.isTerm() 
           && dt1.functor() == dt2.functor()) {

      for (auto c : dt1.allArgs().zip(dt2.allArgs())) {
        pushTodo(make_pair(std::move(c.first), std::move(c.second)));
      }

    } else {
      mismatch = true;
      break;
    }

    ASS(!mismatch)
  }

  if(mismatch) {
    toDo.reset();
  }

  bdDone();

  if(mismatch) {
    localBD.backtrack();
  } else {
    if(bdIsRecording()) {
      bdCommit(localBD);
    }
    localBD.drop();
  }

  DEBUG_UNIFY(0, *this)
  return !mismatch;
}